

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

void stbiw__write_pixel(stbi__write_context *s,int rgb_dir,int comp,int write_alpha,int expand_mono,
                       uchar *d)

{
  byte bVar1;
  int iVar2;
  uchar *puVar3;
  long lVar4;
  void *pvVar5;
  undefined4 in_register_00000084;
  uchar *puVar6;
  uchar px [3];
  uchar local_29;
  uchar local_28;
  uchar local_27;
  uchar arr [3];
  uchar local_23 [3];
  
  puVar6 = (uchar *)CONCAT44(in_register_00000084,expand_mono);
  switch(rgb_dir) {
  case 1:
switchD_00115bb6_caseD_1:
    pvVar5 = s->context;
    iVar2 = 1;
    puVar3 = puVar6;
    goto LAB_00115bfd;
  case 2:
    if (write_alpha == 0) goto switchD_00115bb6_caseD_1;
    local_29 = *puVar6;
    puVar3 = &local_29;
    local_28 = local_29;
    local_27 = local_29;
    goto LAB_00115bf6;
  case 3:
switchD_00115bb6_caseD_3:
    px[2] = puVar6[2];
    px[0] = *puVar6;
    px[1] = puVar6[1];
    puVar3 = local_23;
    break;
  case 4:
    if (comp != 0) goto switchD_00115bb6_caseD_3;
    bVar1 = puVar6[3];
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      px[lVar4] = (char)((int)(((uint)puVar6[lVar4] - (uint)(byte)(&DAT_001291cc)[lVar4]) *
                              (uint)bVar1) / 0xff) + (&DAT_001291cc)[lVar4];
    }
    puVar3 = arr;
    break;
  default:
    goto switchD_00115bb6_default;
  }
  *puVar3 = px[2];
  puVar3[1] = px[1];
  puVar3[2] = px[0];
LAB_00115bf6:
  pvVar5 = s->context;
  iVar2 = 3;
LAB_00115bfd:
  (*s->func)(pvVar5,puVar3,iVar2);
switchD_00115bb6_default:
  if (0 < comp) {
    (*s->func)(s->context,puVar6 + (long)rgb_dir + -1,1);
  }
  return;
}

Assistant:

static void stbiw__write_pixel(stbi__write_context *s, int rgb_dir, int comp, int write_alpha, int expand_mono, unsigned char *d)
{
   unsigned char bg[3] = { 255, 0, 255}, px[3];
   int k;

   if (write_alpha < 0)
      s->func(s->context, &d[comp - 1], 1);

   switch (comp) {
      case 1:
         s->func(s->context,d,1);
         break;
      case 2:
         if (expand_mono)
            stbiw__write3(s, d[0], d[0], d[0]); // monochrome bmp
         else
            s->func(s->context, d, 1);  // monochrome TGA
         break;
      case 4:
         if (!write_alpha) {
            // composite against pink background
            for (k = 0; k < 3; ++k)
               px[k] = bg[k] + ((d[k] - bg[k]) * d[3]) / 255;
            stbiw__write3(s, px[1 - rgb_dir], px[1], px[1 + rgb_dir]);
            break;
         }
         /* FALLTHROUGH */
      case 3:
         stbiw__write3(s, d[1 - rgb_dir], d[1], d[1 + rgb_dir]);
         break;
   }
   if (write_alpha > 0)
      s->func(s->context, &d[comp - 1], 1);
}